

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O0

void __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::DFSIt
          (DFSIt<dg::vr::VRCodeGraph::LazyVisit> *this,Function *f,VRLocation *start,Dir d)

{
  Dir in_ECX;
  VRLocation **in_RDX;
  Function *in_RSI;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> *in_RDI;
  VRLocation *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  LazyVisit::LazyVisit((LazyVisit *)0x1c1466);
  in_RDI->function = in_RSI;
  std::
  vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ::vector((vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
            *)0x1c147d);
  in_RDI->dir = in_ECX;
  std::
  vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
  ::emplace_back<dg::vr::VRLocation*,int,decltype(nullptr)>
            ((vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
              *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDX,
             (int *)(ulong)in_stack_ffffffffffffffd0,(void **)0x0);
  visit(in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

DFSIt(const llvm::Function &f, const VRLocation *start, Dir d)
                : function(&f), dir(d) {
            stack.emplace_back(const_cast<VRLocation *>(start), 0, nullptr);
            visit(const_cast<VRLocation *>(start));
        }